

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.h
# Opt level: O2

bool __thiscall
Memory::CustomHeap::
CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
AllocSecondary(CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
               *this,void *segment,ULONG_PTR functionStart,size_t functionSize_t,ushort pdataCount,
              ushort xdataSize,SecondaryAllocation *allocation)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this_00;
  HeapPageAllocator<Memory::VirtualAllocWrapper> *this_01;
  
  bVar2 = CCLock::IsLocked((CCLock *)this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.h"
                       ,0x13b,"(this->cs.IsLocked())","this->cs.IsLocked()");
    if (!bVar2) goto LAB_00619c55;
    *puVar3 = 0;
  }
  if (functionSize_t >> 0x20 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.h"
                       ,0x13c,"(functionSize_t <= ((uint32_t)~((uint32_t)0)))",
                       "functionSize_t <= MAXUINT32");
    if (!bVar2) goto LAB_00619c55;
    *puVar3 = 0;
  }
  if (segment == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.h"
                       ,0x13e,"(segment)","segment");
    if (!bVar2) {
LAB_00619c55:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = IsPreReservedSegment(this,segment);
  if (bVar2) {
    this_00 = GetPreReservedPageAllocator(this,segment);
    bVar2 = HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper>::AllocSecondary
                      (this_00,segment,functionStart,(DWORD)functionSize_t,pdataCount,xdataSize,
                       allocation);
    return bVar2;
  }
  this_01 = GetPageAllocator(this,segment);
  bVar2 = HeapPageAllocator<Memory::VirtualAllocWrapper>::AllocSecondary
                    (this_01,segment,functionStart,(DWORD)functionSize_t,pdataCount,xdataSize,
                     allocation);
  return bVar2;
}

Assistant:

bool AllocSecondary(void* segment, ULONG_PTR functionStart, size_t functionSize_t, ushort pdataCount, ushort xdataSize, SecondaryAllocation* allocation)
    {
        Assert(this->cs.IsLocked());
        Assert(functionSize_t <= MAXUINT32);
        DWORD functionSize = static_cast<DWORD>(functionSize_t);
        Assert(segment);
        if (IsPreReservedSegment(segment))
        {
            return this->GetPreReservedPageAllocator(segment)->AllocSecondary(segment, functionStart, functionSize, pdataCount, xdataSize, allocation);
        }
        else
        {
            return this->GetPageAllocator(segment)->AllocSecondary(segment, functionStart, functionSize, pdataCount, xdataSize, allocation);
        }
    }